

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Literal * wasm::Literal::makeNull(Literal *__return_storage_ptr__,HeapType type)

{
  BasicHeapType id;
  HeapType local_28;
  Type local_20;
  HeapType local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  id = HeapType::getBottom(&local_18);
  HeapType::HeapType(&local_28,id);
  Type::Type(&local_20,local_28,Nullable,Inexact);
  ::wasm::Literal::Literal(__return_storage_ptr__,local_20);
  return __return_storage_ptr__;
}

Assistant:

static Literal makeNull(HeapType type) {
    return Literal(Type(type.getBottom(), Nullable));
  }